

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunningSection::hasUntestedSections(RunningSection *this)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __lhs;
  vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_> *in_RDI;
  const_iterator it;
  bool local_1;
  
  if (*(int *)&(in_RDI->
               super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
               )._M_impl.super__Vector_impl_data._M_start == 1) {
    local_1 = true;
  }
  else {
    this_00 = std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::begin
                        (in_RDI);
    while( true ) {
      __lhs = std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>::end
                        (in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                          *)__lhs._M_current,
                         (__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                          *)in_RDI);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
      ::operator*((__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                   *)&stack0xffffffffffffffe8);
      bVar1 = hasUntestedSections((RunningSection *)this_00._M_current);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
      ::operator++((__normal_iterator<Catch::RunningSection_*const_*,_std::vector<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>_>
                    *)&stack0xffffffffffffffe8);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hasUntestedSections() const {
            if( m_state == Unknown )
                return true;
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->hasUntestedSections() )
                    return true;
            return false;
        }